

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrdp.cpp
# Opt level: O1

void __thiscall pg::RRDPSolver::run(RRDPSolver *this)

{
  vector<int,std::allocator<int>> *this_00;
  int p_00;
  Game *pGVar1;
  uint64_t *puVar2;
  pointer piVar3;
  iterator __position;
  vector<int,_std::allocator<int>_> *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  long *plVar17;
  ostream *poVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  pointer *ppiVar25;
  int iVar26;
  pointer piVar27;
  int p;
  int res;
  vector<int,_std::allocator<int>_> P;
  uint local_80;
  uint local_7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_70;
  int *local_68;
  int *local_60;
  int local_54;
  _label_vertex local_50;
  ulong local_40;
  int local_34;
  
  pGVar1 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
  iVar26 = *(int *)((long)pGVar1->_priority + ((pGVar1->n_vertices << 0x20) + -0x100000000 >> 0x1e))
  ;
  uVar24 = (ulong)(iVar26 + 1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar24;
  uVar10 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar11 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar11 = 0xffffffffffffffff;
  }
  (this->super_RRSolver).super_PPSolver.max_prio = iVar26;
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  puVar12 = (ulong *)operator_new__(uVar11);
  *puVar12 = uVar24;
  if (iVar26 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar12 + 1),0,
           ((uVar24 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->super_RRSolver).super_PPSolver.regions = (vector<int,_std::allocator<int>_> *)(puVar12 + 1)
  ;
  piVar13 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  (this->super_RRSolver).super_PPSolver.region = piVar13;
  local_60 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                   pGVar1->n_vertices << 2);
  this->region_ = local_60;
  piVar14 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                  pGVar1->n_vertices << 2);
  (this->super_RRSolver).super_PPSolver.strategy = piVar14;
  uVar24 = uVar24 << 2;
  if (iVar26 < -1) {
    uVar24 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar24);
  (this->super_RRSolver).super_PPSolver.inverse = piVar15;
  uVar10 = pGVar1->n_vertices;
  if (0 < (long)uVar10) {
    puVar2 = ((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits;
    uVar11 = 0;
    do {
      iVar26 = -2;
      if ((puVar2[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        iVar26 = pGVar1->_priority[uVar11];
      }
      piVar13[uVar11] = iVar26;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (0 < (long)uVar10) {
    memset(local_60,0xff,uVar10 * 4);
    memset(piVar14,0xff,uVar10 * 4);
  }
  uVar10 = (ulong)((int)uVar10 - 1);
  (this->super_RRSolver).super_PPSolver.promotions = 0;
  local_78._M_current = (int *)0x0;
  _Stack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  local_40 = 0;
  iVar26 = 0;
  iVar22 = 0;
  local_54 = 0;
  do {
    if ((int)uVar10 < 0) {
      local_80 = 0xffffffff;
    }
    else {
      local_80 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar10];
    }
    if (-1 < (int)uVar10) {
      do {
        iVar19 = (int)uVar10;
        if ((((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar10] !=
             local_80) ||
           (((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits[uVar10 >> 6] >>
              (uVar10 & 0x3f) & 1) == 0 &&
            ((this->super_RRSolver).super_PPSolver.region[uVar10] <= (int)local_80))))
        goto LAB_0015f30e;
        uVar10 = (ulong)(iVar19 - 1);
      } while (0 < iVar19);
      uVar10 = 0xffffffff;
    }
LAB_0015f30e:
    pGVar1 = (this->super_RRSolver).super_PPSolver.super_Solver.game;
    iVar19 = (int)uVar10;
    if (iVar19 < 0) {
      local_60 = (int *)CONCAT44(local_60._4_4_,iVar22);
      lVar23 = pGVar1->n_vertices;
      if (lVar23 < 1) {
        uVar20 = 0xffffffff;
      }
      else {
        uVar20 = 0xffffffff;
        lVar21 = 0;
        do {
          uVar7 = this->region_[lVar21];
          if (this->region_[lVar21] < (int)uVar20) {
            uVar7 = uVar20;
          }
          uVar20 = uVar7;
          lVar21 = lVar21 + 1;
        } while (lVar23 != lVar21);
      }
      if (uVar20 == 0xffffffff) {
        bVar8 = true;
      }
      else {
        if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
          poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"performing delayed promotions of player ",0x28);
          plVar17 = (long *)std::ostream::operator<<(poVar18,uVar20 & 1);
          std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
          std::ostream::put((char)plVar17);
          std::ostream::flush();
        }
        local_50.g = (Game *)((ulong)local_50.g & 0xffffffff00000000);
        if (0 < ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices) {
          lVar23 = 0;
          do {
            piVar13 = (this->super_RRSolver).super_PPSolver.region;
            if ((piVar13[lVar23] != 0xfffffffe) && (this->region_[lVar23] != -1)) {
              if (((piVar13[lVar23] ^ uVar20) & 1) == 0) {
                piVar13[lVar23] = this->region_[lVar23];
                this_00 = (vector<int,std::allocator<int>> *)
                          ((this->super_RRSolver).super_PPSolver.regions + piVar13[(int)local_50.g])
                ;
                __position._M_current = *(int **)(this_00 + 8);
                if (__position._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position,(int *)&local_50);
                }
                else {
                  *__position._M_current = (int)local_50.g;
                  *(int **)(this_00 + 8) = __position._M_current + 1;
                }
              }
              this->region_[(int)local_50.g] = -1;
            }
            lVar23 = (long)(int)local_50.g + 1;
            local_50.g = (Game *)CONCAT44(local_50.g._4_4_,(int)lVar23);
          } while (lVar23 < ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices);
        }
        if (_Stack_70._M_current != local_78._M_current) {
          _Stack_70._M_current = local_78._M_current;
        }
        if ((this->super_RRSolver).super_PPSolver.super_Solver.trace != 0) {
          poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"finished performing delayed promotions",0x26);
          std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
        }
        local_54 = local_54 + 1;
        uVar10 = (ulong)(uint)(this->super_RRSolver).super_PPSolver.inverse[uVar20];
        iVar22 = (int)local_60;
        if ((uVar20 & 1) == 0) {
          iVar22 = iVar26;
          iVar26 = (int)local_60;
        }
        piVar13 = &(this->super_RRSolver).super_PPSolver.promotions;
        *piVar13 = *piVar13 + iVar26;
        local_40 = (ulong)(uint)((int)local_40 + iVar22);
        bVar8 = false;
        iVar26 = 0;
        iVar22 = 0;
      }
    }
    else {
      piVar13 = pGVar1->_priority;
      if (piVar13[uVar10] == local_80) {
        (this->super_RRSolver).super_PPSolver.inverse[(int)local_80] = iVar19;
        p_00 = piVar13[uVar10];
        iVar9 = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[5])
                          (this,(ulong)local_80);
        bVar8 = PPSolver::setupRegion((PPSolver *)this,iVar19,p_00,(bool)((byte)iVar9 ^ 1));
        if (bVar8) {
          do {
            if (1 < (this->super_RRSolver).super_PPSolver.super_Solver.trace) {
              PPSolver::reportRegion((PPSolver *)this,local_80);
            }
            local_7c = (*(this->super_RRSolver).super_PPSolver.super_Solver._vptr_Solver[4])
                                 (this,uVar10,(ulong)local_80);
            if (local_7c == 0xffffffff) {
              PPSolver::setDominion((PPSolver *)this,local_80);
              lVar23 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
              if (0 < lVar23) {
                memset(this->region_,0xff,lVar23 * 4);
              }
              uVar10 = (ulong)((int)lVar23 - 1);
              if (_Stack_70._M_current != local_78._M_current) {
                _Stack_70._M_current = local_78._M_current;
              }
              bVar8 = false;
              iVar26 = 0;
              iVar22 = 0;
            }
            else {
              if (local_7c == 0xfffffffe) {
                if (-1 < (int)uVar10) {
                  do {
                    iVar19 = (int)uVar10;
                    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar10]
                        != local_80) goto LAB_0015f710;
                    uVar10 = (ulong)(iVar19 - 1);
                  } while (0 < iVar19);
LAB_0015f70b:
                  uVar10 = 0xffffffff;
                }
              }
              else {
                _Var16._M_current = local_78._M_current;
                if (local_78._M_current == _Stack_70._M_current) {
                  bVar8 = false;
                }
                else {
                  do {
                    piVar13 = _Var16._M_current + 1;
                    bVar8 = false;
                    if ((*_Var16._M_current < (int)local_7c &
                        ((byte)*_Var16._M_current ^ (byte)local_7c)) != 0) {
                      bVar8 = true;
                      break;
                    }
                    _Var16._M_current = piVar13;
                  } while (piVar13 != _Stack_70._M_current);
                }
                if ((!bVar8) &&
                   (uVar11 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices,
                   0 < (long)uVar11)) {
                  uVar24 = 0;
                  do {
                    if ((((((this->super_RRSolver).super_PPSolver.super_Solver.disabled)->_bits
                           [uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) &&
                        ((this->super_RRSolver).super_PPSolver.region[uVar24] < (int)local_7c)) &&
                       ((int)local_7c <= this->region_[uVar24])) {
                      bVar8 = true;
                      break;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar11 != uVar24);
                }
                if (!bVar8) {
                  PPSolver::promote((PPSolver *)this,local_80,local_7c);
                  _Var16 = std::
                           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                     (local_78,_Stack_70,(_Iter_equals_val<const_int>)&local_80);
                  if ((_Var16._M_current != _Stack_70._M_current) &&
                     (_Stack_70._M_current != _Var16._M_current)) {
                    _Stack_70 = _Var16;
                  }
                  if (_Stack_70._M_current == local_68) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_78,
                               (iterator)_Stack_70._M_current,(int *)&local_7c);
                  }
                  else {
                    *_Stack_70._M_current = local_7c;
                    _Stack_70._M_current = _Stack_70._M_current + 1;
                  }
                  lVar23 = ((this->super_RRSolver).super_PPSolver.super_Solver.game)->n_vertices;
                  if (0 < lVar23) {
                    piVar13 = (this->super_RRSolver).super_PPSolver.region;
                    piVar14 = this->region_;
                    lVar21 = 0;
                    do {
                      if ((piVar13[lVar21] != 2) && (piVar14[lVar21] <= (int)local_7c)) {
                        piVar14[lVar21] = -1;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar23 != lVar21);
                  }
                  uVar10 = (ulong)(uint)(this->super_RRSolver).super_PPSolver.inverse[(int)local_7c]
                  ;
                  local_80 = local_7c;
                  bVar8 = true;
                  goto LAB_0015f76c;
                }
                iVar19 = (this->super_RRSolver).super_PPSolver.super_Solver.trace;
                if (iVar19 < 2) {
                  if (iVar19 != 0) {
                    poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,"\x1b[1;33mdelayed \x1b[36m",0x14);
                    poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_80);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18," \x1b[37mto \x1b[36m",0xe);
                    poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_7c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
                    std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
                    goto LAB_0015f68f;
                  }
                }
                else {
                  poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,"\x1b[1;33mdelayed \x1b[36m",0x14);
                  poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_80);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18," \x1b[37mto \x1b[36m",0xe);
                  poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_7c);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m:",4);
                  local_60 = (int *)CONCAT44(local_60._4_4_,iVar22);
                  pvVar4 = (this->super_RRSolver).super_PPSolver.regions;
                  piVar3 = pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  local_34 = iVar26;
                  for (piVar27 = pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start; piVar27 != piVar3;
                      piVar27 = piVar27 + 1) {
                    iVar26 = *piVar27;
                    poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18," \x1b[37m",6);
                    local_50.g = (this->super_RRSolver).super_PPSolver.super_Solver.game;
                    local_50.v = iVar26;
                    poVar18 = operator<<(poVar18,&local_50);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\x1b[m",3);
                  }
                  poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
                  std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
                  iVar22 = (int)local_60;
                  iVar26 = local_34;
LAB_0015f68f:
                  std::ostream::put((char)poVar18);
                  std::ostream::flush();
                }
                this->delayed = this->delayed + 1;
                pvVar4 = (this->super_RRSolver).super_PPSolver.regions;
                piVar13 = pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                piVar14 = pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                if (piVar13 != piVar14) {
                  piVar15 = this->region_;
                  do {
                    piVar15[*piVar13] = local_7c;
                    piVar13 = piVar13 + 1;
                  } while (piVar13 != piVar14);
                }
                iVar26 = iVar26 + (local_80 & 1);
                iVar22 = iVar22 + (local_80 & 1 ^ 1);
                if (-1 < (int)uVar10) {
                  do {
                    iVar19 = (int)uVar10;
                    if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar10]
                        != local_80) goto LAB_0015f710;
                    uVar10 = (ulong)(iVar19 - 1);
                  } while (0 < iVar19);
                  goto LAB_0015f70b;
                }
              }
LAB_0015f710:
              bVar8 = false;
            }
LAB_0015f76c:
          } while (bVar8);
        }
        else {
          do {
            iVar19 = (int)uVar10;
            if (((this->super_RRSolver).super_PPSolver.super_Solver.game)->_priority[uVar10] !=
                local_80) goto LAB_0015f7f1;
            uVar10 = (ulong)(iVar19 - 1);
          } while (0 < iVar19);
          uVar10 = 0xffffffff;
        }
      }
      else {
        pvVar4 = (this->super_RRSolver).super_PPSolver.regions;
        if (pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            pvVar4[(int)local_80].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          PPSolver::resetRegion((PPSolver *)this,local_80);
        }
      }
LAB_0015f7f1:
      bVar8 = false;
    }
    uVar11 = local_40;
    if (bVar8) {
      pvVar4 = (this->super_RRSolver).super_PPSolver.regions;
      if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar27 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        ppiVar25 = &pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        if (piVar27 != (pointer)0x0) {
          lVar23 = (long)piVar27 * 0x18;
          do {
            pvVar5 = *(void **)((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar23);
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,*(long *)((long)ppiVar25 + lVar23) - (long)pvVar5);
            }
            lVar23 = lVar23 + -0x18;
          } while (lVar23 != 0);
        }
        operator_delete__(ppiVar25,(long)piVar27 * 0x18 + 8);
      }
      piVar13 = (this->super_RRSolver).super_PPSolver.region;
      if (piVar13 != (int *)0x0) {
        operator_delete__(piVar13);
      }
      if (this->region_ != (int *)0x0) {
        operator_delete__(this->region_);
      }
      piVar13 = (this->super_RRSolver).super_PPSolver.strategy;
      if (piVar13 != (int *)0x0) {
        operator_delete__(piVar13);
      }
      piVar13 = (this->super_RRSolver).super_PPSolver.inverse;
      if (piVar13 != (int *)0x0) {
        operator_delete__(piVar13);
      }
      poVar18 = (this->super_RRSolver).super_PPSolver.super_Solver.logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"solved with ",0xc);
      poVar18 = (ostream *)
                std::ostream::operator<<(poVar18,(this->super_RRSolver).super_PPSolver.promotions);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18," promotions, ",0xd);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_54);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"x performing delayed promotions (delayed ",0x29);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->delayed);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", discarded ",0xc);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,(int)uVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", total ",8);
      poVar18 = (ostream *)
                std::ostream::operator<<
                          (poVar18,(int)uVar11 + (this->super_RRSolver).super_PPSolver.promotions);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,")",1);
      std::ios::widen((char)poVar18->_vptr_basic_ostream[-3] + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      if (local_78._M_current != (int *)0x0) {
        operator_delete(local_78._M_current,(long)local_68 - (long)local_78._M_current);
      }
      return;
    }
  } while( true );
}

Assistant:

void
RRDPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    region_ = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) region_[i] = -1;
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;
    int performances = 0;

    // set to track delayed promotions
    std::vector<int> P;
    int del0 = 0, del1 = 0, discarded = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (true) {
        // get current priority and skip all disabled/attracted nodes
        int p = i < 0 ? -1 : priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;

        if (i < 0) {
            int max = -1;
            for (int i=0; i<nodecount(); i++) if (max < region_[i]) max = region_[i];
            if (max == -1) break; // done

            if (trace) logger << "performing delayed promotions of player " << (max&1) << std::endl;
            performances++;
            for (int i=0; i<nodecount(); i++) {
                if (region[i] == -2) continue;
                if (region_[i] != -1) {
                    if ((region[i]&1) == (max&1)) {
                        region[i] = region_[i];
                        regions[region[i]].push_back(i);
                    }
                    region_[i] = -1;
                }
            }
            P.clear();
            if (trace) logger << "finished performing delayed promotions" << std::endl;
            i = inverse[max];
            promotions += (max&1) ? del1 : del0;
            discarded += (max&1) ? del0 : del1;
            del0 = del1 = 0;
            continue;
        }

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR-DP: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, priority(i), !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    // reset everything... (sadly)
                    // for (int j=0; j<nodecount(); j++) region[j] = disabled[j] ? -2 : priority(j);
                    // for (int j=0; j<nodecount(); j++) strategy[j] = -1;
                    for (int j=0; j<nodecount(); j++) region_[j] = -1;
                    P.clear();
                    del0 = del1 = 0;
                    break;
                } else {
                    // check if we are locked or not
                    bool locked = false;
                    for (auto l : P) {
                        if ((l&1) != (res&1) && l < res) {
                            locked = true;
                            break;
                        }
                    }
                    if (!locked) {
                        for (int i=0; i<nodecount(); i++) {
                            if (disabled[i]) continue;
                            if (region[i] < res && res <= region_[i]) {
                                // locked for reason b
                                locked = true;
                                break;
                            }
                        }
                    }
                    if (locked) {
                        // found delayed promotion
                        if (trace >= 2) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m:";
                            for (int n : regions[p]) {
                                logger << " \033[37m" << label_vertex(n) << "\033[m";
                            }
                            logger << std::endl;
                        } else if (trace) {
                            logger << "\033[1;33mdelayed \033[36m" << p << " \033[37mto \033[36m" << res << "\033[m" << std::endl;
                        }
                        delayed++;
                        if (p&1) del1++;
                        else del0++;
                        // emulate delayed promotion in region_
                        for (int i : regions[p]) region_[i] = res;
                        // skip to next priority and break inner loop
                        while (i >= 0 and priority(i) == p) i--;
                        break;
                    } else {
                        // found promotion, perform it
                        promote(p, res);
                        // add promotion to P
                        P.erase(std::remove(P.begin(), P.end(), p), P.end());
                        P.push_back(res);
                        // remove from region_ below res
                        for (int i=0; i<nodecount(); i++) if (region[i] != 2 && region_[i] <= res) region_[i] = -1;
                        // continue loop with higher priority
                        i = inverse[res];
                        p = res;
                    }
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] region_;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions, " << performances << "x performing delayed promotions (delayed " << delayed << ", discarded " << discarded << ", total " << promotions+discarded << ")" << std::endl;
}